

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
               (CodedInputStream *input,int64_t *value)

{
  uint64_t *puVar1;
  bool bVar2;
  uint64_t temp;
  uint64_t local_10;
  
  puVar1 = (uint64_t *)input->buffer_;
  if (*(int *)&input->buffer_end_ - (int)puVar1 < 8) {
    bVar2 = io::CodedInputStream::ReadLittleEndian64Fallback(input,&local_10);
  }
  else {
    local_10 = *puVar1;
    input->buffer_ = (uint8_t *)(puVar1 + 1);
    bVar2 = true;
  }
  if (bVar2 != false) {
    *value = local_10;
  }
  return bVar2;
}

Assistant:

inline bool
WireFormatLite::ReadPrimitive<int64_t, WireFormatLite::TYPE_SFIXED64>(
    io::CodedInputStream* input, int64_t* value) {
  uint64_t temp;
  if (!input->ReadLittleEndian64(&temp)) return false;
  *value = static_cast<int64_t>(temp);
  return true;
}